

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tbx.c
# Opt level: O0

tbx_t * tbx_index(BGZF *fp,int min_shift,tbx_conf_t *conf)

{
  bool bVar1;
  int iVar2;
  hts_idx_t *phVar3;
  kh_s2i_t *pkVar4;
  undefined1 local_90 [8];
  tbx_intv_t intv;
  uint64_t last_off;
  int64_t lineno;
  int fmt;
  int n_lvls;
  int first;
  int ret;
  kstring_t str;
  tbx_t *tbx;
  tbx_conf_t *conf_local;
  int min_shift_local;
  BGZF *fp_local;
  
  bVar1 = false;
  last_off = 0;
  intv.tid = 0;
  intv._36_4_ = 0;
  str.m = 0;
  str.l = 0;
  _first = 0;
  str.s = (char *)calloc(1,0x28);
  *(undefined8 *)str.s = *(undefined8 *)conf;
  *(undefined8 *)(str.s + 8) = *(undefined8 *)&conf->bc;
  *(undefined8 *)(str.s + 0x10) = *(undefined8 *)&conf->meta_char;
  if (min_shift < 1) {
    conf_local._4_4_ = 0xe;
    lineno._4_4_ = 5;
    lineno._0_4_ = 2;
  }
  else {
    lineno._4_4_ = (0x21 - min_shift) / 3;
    lineno._0_4_ = 0;
    conf_local._4_4_ = min_shift;
  }
  do {
    while( true ) {
      iVar2 = bgzf_getline(fp,10,(kstring_t *)&first);
      if (iVar2 < 0) {
        if (*(long *)(str.s + 0x18) == 0) {
          phVar3 = hts_idx_init(0,(int)lineno,intv._32_8_,conf_local._4_4_,lineno._4_4_);
          *(hts_idx_t **)(str.s + 0x18) = phVar3;
        }
        if (*(long *)(str.s + 0x20) == 0) {
          pkVar4 = kh_init_s2i();
          *(kh_s2i_t **)(str.s + 0x20) = pkVar4;
        }
        hts_idx_finish(*(hts_idx_t **)(str.s + 0x18),
                       fp->block_address << 0x10 | (long)(int)(fp->block_offset & 0xffff));
        tbx_set_meta((tbx_t *)str.s);
        free((void *)str.m);
        return (tbx_t *)str.s;
      }
      last_off = last_off + 1;
      if (((long)*(int *)(str.s + 0x14) < (long)last_off) &&
         ((int)*(char *)str.m != *(int *)(str.s + 0x10))) break;
      intv._32_8_ = fp->block_address << 0x10 | (long)(int)(fp->block_offset & 0xffff);
    }
    if (!bVar1) {
      phVar3 = hts_idx_init(0,(int)lineno,intv._32_8_,conf_local._4_4_,lineno._4_4_);
      *(hts_idx_t **)(str.s + 0x18) = phVar3;
      bVar1 = true;
    }
    get_intv((tbx_t *)str.s,(kstring_t *)&first,(tbx_intv_t *)local_90,1);
    iVar2 = hts_idx_push(*(hts_idx_t **)(str.s + 0x18),(int)intv.se,local_90._0_4_,(int)intv.beg,
                         fp->block_address << 0x10 | (long)(int)(fp->block_offset & 0xffff),1);
  } while (-1 < iVar2);
  free((void *)str.m);
  tbx_destroy((tbx_t *)str.s);
  return (tbx_t *)0x0;
}

Assistant:

tbx_t *tbx_index(BGZF *fp, int min_shift, const tbx_conf_t *conf)
{
    tbx_t *tbx;
    kstring_t str;
    int ret, first = 0, n_lvls, fmt;
    int64_t lineno = 0;
    uint64_t last_off = 0;
    tbx_intv_t intv;

    str.s = 0; str.l = str.m = 0;
    tbx = (tbx_t*)calloc(1, sizeof(tbx_t));
    tbx->conf = *conf;
    if (min_shift > 0) n_lvls = (TBX_MAX_SHIFT - min_shift + 2) / 3, fmt = HTS_FMT_CSI;
    else min_shift = 14, n_lvls = 5, fmt = HTS_FMT_TBI;
    while ((ret = bgzf_getline(fp, '\n', &str)) >= 0) {
        ++lineno;
        if (lineno <= tbx->conf.line_skip || str.s[0] == tbx->conf.meta_char) {
            last_off = bgzf_tell(fp);
            continue;
        }
        if (first == 0) {
            tbx->idx = hts_idx_init(0, fmt, last_off, min_shift, n_lvls);
            first = 1;
        }
        get_intv(tbx, &str, &intv, 1);
        ret = hts_idx_push(tbx->idx, intv.tid, intv.beg, intv.end, bgzf_tell(fp), 1);
        if (ret < 0)
        {
            free(str.s);
            tbx_destroy(tbx);
            return NULL;
        }
    }
    if ( !tbx->idx ) tbx->idx = hts_idx_init(0, fmt, last_off, min_shift, n_lvls);   // empty file
    if ( !tbx->dict ) tbx->dict = kh_init(s2i);
    hts_idx_finish(tbx->idx, bgzf_tell(fp));
    tbx_set_meta(tbx);
    free(str.s);
    return tbx;
}